

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O0

bool __thiscall ON_Brep::Write(ON_Brep *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int iVar2;
  uint minor_version_00;
  uint uVar3;
  uint uVar4;
  ON_BrepFace *pOVar5;
  shared_ptr<const_ON_Mesh> *psVar6;
  element_type *peVar7;
  bool local_a9;
  undefined1 local_78 [7];
  bool bWriteRegionTopology;
  shared_ptr<const_ON_Mesh> mesh_1;
  undefined1 local_58 [8];
  shared_ptr<const_ON_Mesh> mesh;
  int local_40;
  uchar b;
  int fi;
  int face_count;
  bool rc;
  int minor_version;
  ON_Brep *v2brep;
  ON_Brep *brep;
  ON_BinaryArchive *file_local;
  ON_Brep *this_local;
  
  iVar2 = ON_BinaryArchive::Archive3dmVersion(file);
  minor_version_00 = 3;
  if (iVar2 < 0x33) {
    minor_version_00 = 2;
  }
  fi._3_1_ = ON_BinaryArchive::Write3dmChunkVersion(file,3,minor_version_00);
  if (fi._3_1_) {
    fi._3_1_ = ON_CurveArray::Write(&this->m_C2,file);
  }
  if (fi._3_1_ != false) {
    fi._3_1_ = ON_CurveArray::Write(&this->m_C3,file);
  }
  if (fi._3_1_ != false) {
    fi._3_1_ = ON_SurfaceArray::Write(&this->m_S,file);
  }
  if (fi._3_1_ != false) {
    fi._3_1_ = ON_BrepVertexArray::Write(&this->m_V,file);
  }
  if (fi._3_1_ != false) {
    fi._3_1_ = ON_BrepEdgeArray::Write(&this->m_E,file);
  }
  if (fi._3_1_ != false) {
    fi._3_1_ = ON_BrepTrimArray::Write(&this->m_T,file);
  }
  if (fi._3_1_ != false) {
    fi._3_1_ = ON_BrepLoopArray::Write(&this->m_L,file);
  }
  if (fi._3_1_ != false) {
    fi._3_1_ = ON_BrepFaceArray::Write(&this->m_F,file);
  }
  if (fi._3_1_ != false) {
    fi._3_1_ = ON_BinaryArchive::WritePoint(file,&(this->m_bbox).m_min);
  }
  if (fi._3_1_ != false) {
    fi._3_1_ = ON_BinaryArchive::WritePoint(file,&(this->m_bbox).m_max);
  }
  if (fi._3_1_ != false) {
    iVar2 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F);
    fi._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0);
    if (fi._3_1_) {
      for (local_40 = 0; fi._3_1_ != false && local_40 < iVar2; local_40 = local_40 + 1) {
        bVar1 = ON_BinaryArchive::Save3dmRenderMesh(file,brep_object);
        if (bVar1) {
          pOVar5 = ON_ClassArray<ON_BrepFace>::operator[]
                             ((ON_ClassArray<ON_BrepFace> *)&this->m_F,local_40);
          psVar6 = ON_BrepFace::SharedMesh(pOVar5,render_mesh);
          std::shared_ptr<const_ON_Mesh>::shared_ptr((shared_ptr<const_ON_Mesh> *)local_58,psVar6);
        }
        else {
          std::shared_ptr<const_ON_Mesh>::shared_ptr
                    ((shared_ptr<const_ON_Mesh> *)local_58,(nullptr_t)0x0);
        }
        mesh.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
             std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_58);
        fi._3_1_ = ON_BinaryArchive::WriteChar
                             (file,mesh.
                                   super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi._7_1_);
        if ((fi._3_1_) &&
           (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_58), bVar1)) {
          peVar7 = std::__shared_ptr_access<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_58);
          fi._3_1_ = ON_BinaryArchive::WriteObject(file,(ON_Object *)peVar7);
        }
        std::shared_ptr<const_ON_Mesh>::~shared_ptr((shared_ptr<const_ON_Mesh> *)local_58);
      }
      bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
      if (!bVar1) {
        fi._3_1_ = false;
      }
    }
    if (fi._3_1_ != false) {
      fi._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0);
    }
    if (fi._3_1_ != false) {
      for (local_40 = 0; fi._3_1_ != false && local_40 < iVar2; local_40 = local_40 + 1) {
        bVar1 = ON_BinaryArchive::Save3dmAnalysisMesh(file,brep_object);
        if (bVar1) {
          pOVar5 = ON_ClassArray<ON_BrepFace>::operator[]
                             ((ON_ClassArray<ON_BrepFace> *)&this->m_F,local_40);
          psVar6 = ON_BrepFace::SharedMesh(pOVar5,analysis_mesh);
          std::shared_ptr<const_ON_Mesh>::shared_ptr((shared_ptr<const_ON_Mesh> *)local_78,psVar6);
        }
        else {
          std::shared_ptr<const_ON_Mesh>::shared_ptr
                    ((shared_ptr<const_ON_Mesh> *)local_78,(nullptr_t)0x0);
        }
        mesh.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
             std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78);
        fi._3_1_ = ON_BinaryArchive::WriteChar
                             (file,mesh.
                                   super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi._7_1_);
        if ((fi._3_1_) &&
           (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78), bVar1)) {
          peVar7 = std::__shared_ptr_access<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_78);
          fi._3_1_ = ON_BinaryArchive::WriteObject(file,(ON_Object *)peVar7);
        }
        std::shared_ptr<const_ON_Mesh>::~shared_ptr((shared_ptr<const_ON_Mesh> *)local_78);
      }
      bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
      if (!bVar1) {
        fi._3_1_ = false;
      }
    }
  }
  if ((fi._3_1_ != false) && (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_is_solid), !bVar1)) {
    fi._3_1_ = false;
  }
  if (fi._3_1_ != false) {
    local_a9 = false;
    if (this->m_region_topology != (ON_BrepRegionTopology *)0x0) {
      uVar3 = ON_ClassArray<ON_BrepFace>::UnsignedCount((ON_ClassArray<ON_BrepFace> *)&this->m_F);
      local_a9 = false;
      if (uVar3 != 0) {
        uVar3 = ON_ClassArray<ON_BrepFaceSide>::UnsignedCount
                          ((ON_ClassArray<ON_BrepFaceSide> *)this->m_region_topology);
        uVar4 = ON_ClassArray<ON_BrepFace>::UnsignedCount((ON_ClassArray<ON_BrepFace> *)&this->m_F);
        local_a9 = uVar3 == uVar4 * 2;
      }
    }
    if (minor_version_00 < 3) {
      if (((local_a9 != false) && (minor_version_00 == 2)) &&
         (iVar2 = ON_BinaryArchive::Archive3dmVersion(file), iVar2 == 0x32)) {
        Internal_AttachV5RegionTopologyAsUserData(this,file);
      }
    }
    else if (2 < minor_version_00) {
      bVar1 = ON_BinaryArchive::BeginWrite3dmAnonymousChunk(file,1);
      if (!bVar1) {
        return false;
      }
      fi._3_1_ = false;
      bVar1 = ON_BinaryArchive::WriteBool(file,local_a9);
      if ((bVar1) &&
         ((local_a9 == false ||
          (bVar1 = ON_BrepRegionTopology::Write(this->m_region_topology,file), bVar1)))) {
        fi._3_1_ = true;
      }
      bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
      if (!bVar1) {
        fi._3_1_ = false;
      }
    }
  }
  return fi._3_1_;
}

Assistant:

bool ON_Brep::Write( ON_BinaryArchive& file ) const
{
  const ON_Brep* brep = this;
  ON_Brep* v2brep = 0;


  //bool rc = file.Write3dmChunkVersion(3,0); // serialization version
  //bool rc = file.Write3dmChunkVersion(3,1); // added meshes

  int minor_version 
    = (file.Archive3dmVersion() <= 50)
    ? 2
    : 3 // August 9, 2016 m_region_topology added to V6 files.
    ;

  bool rc = file.Write3dmChunkVersion(3,minor_version); // added m_is_solid

  // 2d curves
  if (rc) rc = brep->m_C2.Write(file);

  // 3d curves
  if (rc) rc = brep->m_C3.Write(file);

  // untrimmed surfaces
  if (rc) rc = brep->m_S.Write(file);

  // vertices
  if (rc) rc = brep->m_V.Write(file);

  // edges
  if (rc) rc = brep->m_E.Write(file);

  // trims
  if (rc) rc = brep->m_T.Write(file);

  // loops
  if (rc) rc = brep->m_L.Write(file);

  // faces
  if (rc) rc = brep->m_F.Write(file);

  // bounding box
  if (rc) rc = file.WritePoint( brep->m_bbox.m_min );
  if (rc) rc = file.WritePoint( brep->m_bbox.m_max );

  // end of chunk version 3.0

  if (rc)
  {
    // added for chunk version 3.1
    const int face_count = brep->m_F.Count();
    int fi;
    unsigned char b;

    // write render meshes
    rc = file.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
    if ( rc )
    {
      for ( fi = 0; rc && fi < face_count; fi++ ) {
        const auto mesh = file.Save3dmRenderMesh(ON::object_type::brep_object) ? brep->m_F[fi].SharedMesh(ON::render_mesh) : nullptr;
        b = mesh ? 1 : 0;
        rc = file.WriteChar(b);
        if (rc && mesh) {
          rc = file.WriteObject(*mesh);
        }
      }
      if ( !file.EndWrite3dmChunk() )
      {
        rc = false;
      }
    }

    // write analysis meshes
    if (rc) rc = file.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
    if ( rc )
    {
      for ( fi = 0; rc && fi < face_count; fi++ ) {
        const auto mesh = file.Save3dmAnalysisMesh(ON::object_type::brep_object) ? brep->m_F[fi].SharedMesh(ON::analysis_mesh) : nullptr;
        b = mesh ? 1 : 0;
        rc = file.WriteChar(b);
        if (rc && mesh) {
          rc = file.WriteObject(*mesh);
        }
      }
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }

  }
  // end of chunk version 3.1

  if (rc)
  {
    // use value of "this" m_is_solid to avoid expensive 
    // calculation on the v2brep
    if ( !file.WriteInt( m_is_solid ) )
      rc = false;
  }

  // end of chunk version 3.2

  if (rc)
  {
    const bool bWriteRegionTopology
      = (nullptr != m_region_topology)
      && (m_F.UnsignedCount() > 0)
      && (m_region_topology->m_FS.UnsignedCount() == 2 * m_F.UnsignedCount());

    if (minor_version <= 2)
    {
      if (bWriteRegionTopology && minor_version == 2 && 50 == file.Archive3dmVersion())
        Internal_AttachV5RegionTopologyAsUserData(file);
    }
    else if (minor_version >= 3)
    {
      // begin chunk verson 3.3

      // region topology chunk added
      if (!file.BeginWrite3dmAnonymousChunk(1))
        return false;

      rc = false;
      for (;;)
      {
        if (!file.WriteBool(bWriteRegionTopology))
          break;
        if (bWriteRegionTopology)
        {
          if (!m_region_topology->Write(file))
            break;
        }
        rc = true;
        break;
      }
      if (!file.EndWrite3dmChunk())
        rc = false;
      // end chunk version 3.3
    }
  }

  if ( 0 != v2brep )
    delete v2brep;

  return rc;
}